

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extra_type_info.cpp
# Opt level: O1

int64_t duckdb::EnumType::GetPos(LogicalType *type,string_t *key)

{
  PhysicalType PVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  InternalException *this;
  optional_ptr<duckdb::ExtraTypeInfo,_true> info;
  optional_ptr<duckdb::ExtraTypeInfo,_true> local_48;
  string local_40;
  
  local_48.ptr = (type->type_info_).internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  PVar1 = type->physical_type_;
  if (PVar1 == UINT32) {
    optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid(&local_48);
    cVar4 = std::
            _Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_int>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_int>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_int>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_int>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&local_48.ptr[3].type,key);
    if (cVar4.super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_int>,_true>.
        _M_cur != (__node_type *)0x0) {
      return (ulong)*(uint *)((long)cVar4.
                                    super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_int>,_true>
                                    ._M_cur + 0x18);
    }
  }
  else if (PVar1 == UINT16) {
    optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid(&local_48);
    cVar3 = std::
            _Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_short>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_short>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_short>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_short>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&local_48.ptr[3].type,key);
    if (cVar3.super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_short>,_true>.
        _M_cur != (__node_type *)0x0) {
      return (ulong)*(ushort *)
                     ((long)cVar3.
                            super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_short>,_true>
                            ._M_cur + 0x18);
    }
  }
  else {
    if (PVar1 != UINT8) {
      this = (InternalException *)__cxa_allocate_exception(0x10);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "ENUM can only have unsigned integers (except UINT64) as physical types","");
      InternalException::InternalException(this,&local_40);
      __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    optional_ptr<duckdb::ExtraTypeInfo,_true>::CheckValid(&local_48);
    cVar2 = std::
            _Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_char>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_char>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<duckdb::string_t,_std::pair<const_duckdb::string_t,_unsigned_char>,_std::allocator<std::pair<const_duckdb::string_t,_unsigned_char>_>,_std::__detail::_Select1st,_duckdb::StringEquality,_duckdb::StringHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&local_48.ptr[3].type,key);
    if (cVar2.super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_char>,_true>.
        _M_cur != (__node_type *)0x0) {
      return (ulong)*(byte *)((long)cVar2.
                                    super__Node_iterator_base<std::pair<const_duckdb::string_t,_unsigned_char>,_true>
                                    ._M_cur + 0x18);
    }
  }
  return -1;
}

Assistant:

int64_t EnumType::GetPos(const LogicalType &type, const string_t &key) {
	auto info = type.AuxInfo();
	switch (type.InternalType()) {
	case PhysicalType::UINT8:
		return TemplatedGetPos(info->Cast<EnumTypeInfoTemplated<uint8_t>>().GetValues(), key);
	case PhysicalType::UINT16:
		return TemplatedGetPos(info->Cast<EnumTypeInfoTemplated<uint16_t>>().GetValues(), key);
	case PhysicalType::UINT32:
		return TemplatedGetPos(info->Cast<EnumTypeInfoTemplated<uint32_t>>().GetValues(), key);
	default:
		throw InternalException("ENUM can only have unsigned integers (except UINT64) as physical types");
	}
}